

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NavierStokesBase.cpp
# Opt level: O3

void __thiscall
NavierStokesBase::computeInitialDt
          (NavierStokesBase *this,int finest_level,int param_2,
          Vector<int,_std::allocator<int>_> *n_cycle,
          Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *param_4,
          Vector<double,_std::allocator<double>_> *dt_level,Real stop_time)

{
  pointer pSVar1;
  pointer piVar2;
  pointer pdVar3;
  double dVar4;
  TimeCenter TVar5;
  NavierStokesBase *this_00;
  int iVar6;
  ulong uVar7;
  double dVar8;
  Real RVar9;
  
  if ((this->super_AmrLevel).level < 1) {
    if (finest_level < 0) {
      dVar8 = 1e+100;
    }
    else {
      dVar8 = 1e+100;
      iVar6 = 1;
      uVar7 = 0;
      do {
        this_00 = getLevel(this,(int)uVar7);
        RVar9 = initialTimeStep(this_00);
        (dt_level->super_vector<double,_std::allocator<double>_>).
        super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
        [uVar7] = RVar9;
        iVar6 = iVar6 * (n_cycle->super_vector<int,_std::allocator<int>_>).
                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar7];
        dVar4 = (double)iVar6 * RVar9;
        if (dVar8 <= (double)iVar6 * RVar9) {
          dVar4 = dVar8;
        }
        dVar8 = dVar4;
        uVar7 = uVar7 + 1;
      } while (finest_level + 1 != uVar7);
    }
    if (0.0 <= stop_time) {
      pSVar1 = (this->super_AmrLevel).state.
               super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
               super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl.
               super__Vector_impl_data._M_start;
      TVar5 = amrex::StateDescriptor::timeType(pSVar1->desc);
      if (TVar5 == Point) {
        RVar9 = (pSVar1->new_time).stop;
      }
      else {
        RVar9 = ((pSVar1->new_time).start + (pSVar1->new_time).stop) * 0.5;
      }
      if (stop_time - dVar8 * 0.0001 < dVar8 + RVar9) {
        dVar8 = stop_time - RVar9;
      }
    }
    if (-1 < finest_level) {
      piVar2 = (n_cycle->super_vector<int,_std::allocator<int>_>).
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start;
      pdVar3 = (dt_level->super_vector<double,_std::allocator<double>_>).
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start;
      iVar6 = 1;
      uVar7 = 0;
      do {
        iVar6 = iVar6 * piVar2[uVar7];
        pdVar3[uVar7] = dVar8 / (double)iVar6;
        uVar7 = uVar7 + 1;
      } while (finest_level + 1 != uVar7);
    }
    return;
  }
  return;
}

Assistant:

void
NavierStokesBase::computeInitialDt (int                   finest_level,
				    int                   /*sub_cycle*/,
				    Vector<int>&           n_cycle,
				    const Vector<IntVect>& /*ref_ratio*/,
				    Vector<Real>&          dt_level,
				    Real                  stop_time)
{
    //
    // Grids have been constructed, compute dt for all levels.
    //
    if (level > 0)
        return;

    int i;

    Real dt_0    = 1.0e+100;
    int n_factor = 1;
    ///TODO/DEBUG: This will need to change for optimal subcycling.
    for (i = 0; i <= finest_level; i++)
    {
        dt_level[i] = getLevel(i).initialTimeStep();
        n_factor   *= n_cycle[i];
        dt_0        = std::min(dt_0,n_factor*dt_level[i]);
    }

    //
    // Limit dt's by the value of stop_time.
    //
    if (stop_time >= 0.0)
    {
        const Real eps      = 0.0001*dt_0;
        const Real cur_time = state[State_Type].curTime();
        if ((cur_time + dt_0) > (stop_time - eps))
            dt_0 = stop_time - cur_time;
    }

    n_factor = 1;
    for (i = 0; i <= finest_level; i++)
    {
        n_factor   *= n_cycle[i];
        dt_level[i] = dt_0/( (Real)n_factor );
    }
}